

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::EdgeControlSpecifierSyntax::EdgeControlSpecifierSyntax
          (EdgeControlSpecifierSyntax *this,Token openBracket,
          SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *descriptors,Token closeBracket)

{
  bool bVar1;
  size_t in_RDX;
  SyntaxNode *in_RSI;
  SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *in_RDI;
  pointer in_R8;
  size_t in_R9;
  EdgeDescriptorSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *__range2;
  EdgeDescriptorSyntax *in_stack_ffffffffffffffa0;
  
  SyntaxNode::SyntaxNode((SyntaxNode *)in_RDI,EdgeControlSpecifier);
  (in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode = in_RSI;
  (in_RDI->super_SyntaxListBase).childCount = in_RDX;
  SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::SeparatedSyntaxList
            ((SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *)in_stack_ffffffffffffffa0,
             in_RDI);
  in_RDI[1].elements._M_ptr = in_R8;
  in_RDI[1].elements._M_extent._M_extent_value = in_R9;
  in_RDI[1].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)in_RDI;
  SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *)0x298d86);
  SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *)in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::iterator_base<slang::syntax::EdgeDescriptorSyntax_*>_>
                      ((self_type *)in_stack_ffffffffffffffa0,
                       (iterator_base<slang::syntax::EdgeDescriptorSyntax_*> *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffa0 =
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::iterator_base<slang::syntax::EdgeDescriptorSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::iterator_base<slang::syntax::EdgeDescriptorSyntax_*>,_false>
                      *)0x298dc5);
    (in_stack_ffffffffffffffa0->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::iterator_base<slang::syntax::EdgeDescriptorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::iterator_base<slang::syntax::EdgeDescriptorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::iterator_base<slang::syntax::EdgeDescriptorSyntax_*>,_false>
                *)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

EdgeControlSpecifierSyntax(Token openBracket, const SeparatedSyntaxList<EdgeDescriptorSyntax>& descriptors, Token closeBracket) :
        SyntaxNode(SyntaxKind::EdgeControlSpecifier), openBracket(openBracket), descriptors(descriptors), closeBracket(closeBracket) {
        this->descriptors.parent = this;
        for (auto child : this->descriptors)
            child->parent = this;
    }